

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  long lVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int *piVar4;
  pointer pbVar5;
  long *plVar6;
  string_view separator;
  string_view name;
  undefined1 auVar7 [16];
  char cVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  _anonymous_namespace_ *p_Var12;
  const_iterator cVar13;
  _Rb_tree_node_base *p_Var14;
  optional<cmWindowsRegistry::View> oVar15;
  ulong uVar16;
  char *pcVar17;
  size_t value_00;
  size_t value_01;
  char *value_02;
  size_t value_03;
  size_t value_04;
  char *value_05;
  size_t value_06;
  char *value_07;
  size_t value_08;
  char *value_09;
  char *value_10;
  size_t value_11;
  size_t value_12;
  size_t value_13;
  char *value_14;
  size_t value_15;
  size_t value_16;
  size_t value_17;
  size_t value_18;
  size_t value_19;
  size_t value_20;
  size_t value_21;
  char *value_22;
  size_t value_23;
  size_t value_24;
  cmExecutionStatus *status_00;
  _Storage<cmWindowsRegistry::View,_true> view;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view sVar40;
  string_view value_25;
  string_view value_26;
  string_view separator_00;
  string_view key;
  string_view separator_01;
  string_view value_27;
  string_view key_00;
  string_view separator_02;
  string_view value_28;
  string_view key_01;
  string_view value_29;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view name_06;
  cmWindowsRegistry registry;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  Arguments arguments;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string result_list;
  string cmake_var_name;
  cmArgumentParser<Arguments> parser;
  size_t in_stack_fffffffffffffd18;
  _Alloc_hider in_stack_fffffffffffffd20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  byte local_2c0;
  string local_2b0;
  char local_290 [8];
  cmMakefile *local_288;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Base_ptr local_260;
  size_t local_258;
  char *local_250;
  size_t local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined2 local_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  char *local_208;
  pointer local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  string local_1e8;
  pointer local_1c8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [8];
  char *pcStack_198;
  undefined1 local_190 [16];
  _Any_data local_180;
  undefined1 local_170 [16];
  bool local_160;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_110;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  string local_e8;
  string *local_c8;
  cmMakefile *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = (long)paVar3 - (long)pbVar2 >> 5;
  if (((uVar16 < 2) || (pbVar2->_M_string_length != 6)) ||
     (piVar4 = (int *)(pbVar2->_M_dataplus)._M_p,
     (short)piVar4[1] != 0x544c || *piVar4 != 0x55534552)) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing RESULT specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0022c8d5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270._M_allocated_capacity + 1));
    }
    return false;
  }
  if (((uVar16 < 4) || (pbVar2[2]._M_string_length != 5)) ||
     (piVar4 = (int *)pbVar2[2]._M_dataplus._M_p, (char)piVar4[1] != 'Y' || *piVar4 != 0x52455551))
  {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing QUERY specification","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0022c8d5;
  }
  local_1c8 = pbVar2 + 1;
  if (pbVar2[3]._M_string_length != 0x10) {
LAB_0022c99d:
    if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::info == '\0') &&
       (iVar10 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                      ::info), iVar10 != 0)) {
      cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
      __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                   &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
      __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::info);
    }
    if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::initialized == '\0') {
      cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
      cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::initialized = '\x01';
    }
    local_108 = &local_f8;
    local_100 = 0;
    local_f8 = '\0';
    if (0x7f < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      local_c8 = (string *)&status->Error;
      local_288 = (cmMakefile *)0x3;
      local_48 = 0x414349535948505f;
      uStack_40 = 0x59524f4d454d5f4c;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_108,
                   (&(anonymous_namespace)::DELIM_abi_cxx11_)[(ulong)(local_100 != 0) * 4]);
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_110 = pbVar5 + (long)local_288;
        if (0x15 < pbVar5[(long)local_288]._M_string_length - 4) goto switchD_0022cac4_caseD_5;
        plVar6 = (long *)pbVar5[(long)local_288]._M_dataplus._M_p;
        switch(pbVar5[(long)local_288]._M_string_length) {
        case 4:
          if ((int)*plVar6 != 0x4e445146) break;
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    ((string *)local_b8,&cmCMakeHostSystemInformationCommand::info);
          local_280._0_8_ = &local_270;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_280,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
          in_stack_fffffffffffffd20._M_p = (pointer)local_280._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ == &local_270) {
            local_2d0._8_8_ = local_270._8_8_;
            in_stack_fffffffffffffd20._M_p = (pointer)&local_2d0;
          }
          local_2d0._M_allocated_capacity = local_270._M_allocated_capacity;
          local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._8_8_;
          local_280._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
          local_2c0 = 1;
          local_280._0_8_ = &local_270;
          if ((undefined1 *)local_b8._0_8_ != local_a8) {
            operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
            if ((local_2c0 & 1) != 0) goto LAB_0022d612;
            goto LAB_0022d074;
          }
          goto LAB_0022d612;
        case 7:
          if (*(int *)((long)plVar6 + 3) == 0x5550465f && (int)*plVar6 == 0x5f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x800000);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_16);
          }
          else if (*(int *)((long)plVar6 + 3) == 0x584d4d5f && (int)*plVar6 == 0x5f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,1);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_21);
          }
          else if (*(int *)((long)plVar6 + 3) == 0x4553535f && (int)*plVar6 == 0x5f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,4);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_24);
          }
          else {
            if (*(int *)((long)plVar6 + 3) != 0x454d414e || (int)*plVar6 != 0x4e5f534f) break;
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSName
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_05);
          }
          goto LAB_0022d5c8;
        case 8:
          if (*plVar6 == 0x454d414e54534f48) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetHostname
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_14);
          }
          else if (*plVar6 == 0x54494234365f5349) {
            bVar9 = cmsys::SystemInformation::Is64Bits(&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_20);
          }
          else if (*plVar6 == 0x324553535f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,8);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_23);
          }
          else {
            if (*plVar6 != 0x343641495f534148) break;
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x40);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_03);
          }
          goto LAB_0022d5c8;
        case 10:
          if ((short)plVar6[1] == 0x5046 && *plVar6 == 0x5f4553535f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x800);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_17);
          }
          else if ((short)plVar6[1] == 0x4553 && *plVar6 == 0x41454c45525f534f) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSRelease
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_22);
          }
          else {
            if ((short)plVar6[1] != 0x4e4f || *plVar6 != 0x49535245565f534f) break;
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSVersion
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_09);
          }
          goto LAB_0022d5c8;
        case 0xb:
          if (*(long *)((long)plVar6 + 3) == 0x584d4d5f4553535f && *plVar6 == 0x5f4553535f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x1000);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_18);
          }
          else {
            if (*(long *)((long)plVar6 + 3) != 0x4d524f4654414c50 || *plVar6 != 0x4654414c505f534f)
            break;
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSPlatform
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_10);
          }
          goto LAB_0022d5c8;
        case 0xc:
          if ((int)plVar6[1] == 0x53554c50 && *plVar6 == 0x5f584d4d5f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,2);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_04);
            goto LAB_0022d5c8;
          }
          break;
        case 0xd:
          if (*(long *)((long)plVar6 + 5) == 0x574f4e44335f444d && *plVar6 == 0x5f444d415f534148) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x10);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_06);
            goto LAB_0022d5c8;
          }
          break;
        case 0xe:
          if (*(long *)((long)plVar6 + 6) == 0x454d414e5f524f53 && *plVar6 == 0x4f535345434f5250) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetExtendedProcessorName
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_07);
            goto LAB_0022d5c8;
          }
          break;
        case 0x11:
          auVar29[0] = -((char)*plVar6 == 'H');
          auVar29[1] = -(*(char *)((long)plVar6 + 1) == 'A');
          auVar29[2] = -(*(char *)((long)plVar6 + 2) == 'S');
          auVar29[3] = -(*(char *)((long)plVar6 + 3) == '_');
          auVar29[4] = -(*(char *)((long)plVar6 + 4) == 'S');
          auVar29[5] = -(*(char *)((long)plVar6 + 5) == 'E');
          auVar29[6] = -(*(char *)((long)plVar6 + 6) == 'R');
          auVar29[7] = -(*(char *)((long)plVar6 + 7) == 'I');
          auVar29[8] = -((char)plVar6[1] == 'A');
          auVar29[9] = -(*(char *)((long)plVar6 + 9) == 'L');
          auVar29[10] = -(*(char *)((long)plVar6 + 10) == '_');
          auVar29[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'N');
          auVar29[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'U');
          auVar29[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'M');
          auVar29[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'B');
          auVar29[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'E');
          auVar39[0] = -((char)plVar6[2] == 'R');
          auVar39[1] = 0xff;
          auVar39[2] = 0xff;
          auVar39[3] = 0xff;
          auVar39[4] = 0xff;
          auVar39[5] = 0xff;
          auVar39[6] = 0xff;
          auVar39[7] = 0xff;
          auVar39[8] = 0xff;
          auVar39[9] = 0xff;
          auVar39[10] = 0xff;
          auVar39[0xb] = 0xff;
          auVar39[0xc] = 0xff;
          auVar39[0xd] = 0xff;
          auVar39[0xe] = 0xff;
          auVar39[0xf] = 0xff;
          auVar39 = auVar39 & auVar29;
          if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) == 0xffff) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x200);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_19);
            goto LAB_0022d5c8;
          }
          break;
        case 0x12:
          auVar28[0] = -((char)*plVar6 == 'H');
          auVar28[1] = -(*(char *)((long)plVar6 + 1) == 'A');
          auVar28[2] = -(*(char *)((long)plVar6 + 2) == 'S');
          auVar28[3] = -(*(char *)((long)plVar6 + 3) == '_');
          auVar28[4] = -(*(char *)((long)plVar6 + 4) == 'A');
          auVar28[5] = -(*(char *)((long)plVar6 + 5) == 'M');
          auVar28[6] = -(*(char *)((long)plVar6 + 6) == 'D');
          auVar28[7] = -(*(char *)((long)plVar6 + 7) == '_');
          auVar28[8] = -((char)plVar6[1] == '3');
          auVar28[9] = -(*(char *)((long)plVar6 + 9) == 'D');
          auVar28[10] = -(*(char *)((long)plVar6 + 10) == 'N');
          auVar28[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'O');
          auVar28[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'W');
          auVar28[0xd] = -(*(char *)((long)plVar6 + 0xd) == '_');
          auVar28[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'P');
          auVar28[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'L');
          auVar38[0] = -((char)(short)plVar6[2] == 'U');
          auVar38[1] = -((char)((ushort)(short)plVar6[2] >> 8) == 'S');
          auVar38[2] = 0xff;
          auVar38[3] = 0xff;
          auVar38[4] = 0xff;
          auVar38[5] = 0xff;
          auVar38[6] = 0xff;
          auVar38[7] = 0xff;
          auVar38[8] = 0xff;
          auVar38[9] = 0xff;
          auVar38[10] = 0xff;
          auVar38[0xb] = 0xff;
          auVar38[0xc] = 0xff;
          auVar38[0xd] = 0xff;
          auVar38[0xe] = 0xff;
          auVar38[0xf] = 0xff;
          auVar38 = auVar38 & auVar28;
          if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) == 0xffff) {
            bVar9 = cmsys::SystemInformation::DoesCPUSupportFeature
                              (&cmCMakeHostSystemInformationCommand::info,0x20);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar9,value_11);
            goto LAB_0022d5c8;
          }
          break;
        case 0x14:
          auVar22[0] = -((char)*plVar6 == 'T');
          auVar22[1] = -(*(char *)((long)plVar6 + 1) == 'O');
          auVar22[2] = -(*(char *)((long)plVar6 + 2) == 'T');
          auVar22[3] = -(*(char *)((long)plVar6 + 3) == 'A');
          auVar22[4] = -(*(char *)((long)plVar6 + 4) == 'L');
          auVar22[5] = -(*(char *)((long)plVar6 + 5) == '_');
          auVar22[6] = -(*(char *)((long)plVar6 + 6) == 'V');
          auVar22[7] = -(*(char *)((long)plVar6 + 7) == 'I');
          auVar22[8] = -((char)plVar6[1] == 'R');
          auVar22[9] = -(*(char *)((long)plVar6 + 9) == 'T');
          auVar22[10] = -(*(char *)((long)plVar6 + 10) == 'U');
          auVar22[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'A');
          auVar22[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'L');
          auVar22[0xd] = -(*(char *)((long)plVar6 + 0xd) == '_');
          auVar22[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'M');
          auVar22[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'E');
          iVar10 = (int)plVar6[2];
          auVar32[0] = -((char)iVar10 == 'M');
          auVar32[1] = -((char)((uint)iVar10 >> 8) == 'O');
          auVar32[2] = -((char)((uint)iVar10 >> 0x10) == 'R');
          auVar32[3] = -((char)((uint)iVar10 >> 0x18) == 'Y');
          auVar32[4] = 0xff;
          auVar32[5] = 0xff;
          auVar32[6] = 0xff;
          auVar32[7] = 0xff;
          auVar32[8] = 0xff;
          auVar32[9] = 0xff;
          auVar32[10] = 0xff;
          auVar32[0xb] = 0xff;
          auVar32[0xc] = 0xff;
          auVar32[0xd] = 0xff;
          auVar32[0xe] = 0xff;
          auVar32[0xf] = 0xff;
          auVar32 = auVar32 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetTotalVirtualMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_01);
            goto LAB_0022d5c8;
          }
          break;
        case 0x15:
          auVar25[0] = -((char)*plVar6 == 'T');
          auVar25[1] = -(*(char *)((long)plVar6 + 1) == 'O');
          auVar25[2] = -(*(char *)((long)plVar6 + 2) == 'T');
          auVar25[3] = -(*(char *)((long)plVar6 + 3) == 'A');
          auVar25[4] = -(*(char *)((long)plVar6 + 4) == 'L');
          auVar25[5] = -(*(char *)((long)plVar6 + 5) == '_');
          auVar25[6] = -(*(char *)((long)plVar6 + 6) == 'P');
          auVar25[7] = -(*(char *)((long)plVar6 + 7) == 'H');
          auVar25[8] = -((char)plVar6[1] == 'Y');
          auVar25[9] = -(*(char *)((long)plVar6 + 9) == 'S');
          auVar25[10] = -(*(char *)((long)plVar6 + 10) == 'I');
          auVar25[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'C');
          auVar25[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'A');
          auVar25[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'L');
          auVar25[0xe] = -(*(char *)((long)plVar6 + 0xe) == '_');
          auVar25[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'M');
          auVar35[0] = -(*(char *)((long)plVar6 + 5) == (char)local_48);
          auVar35[1] = -(*(char *)((long)plVar6 + 6) == local_48._1_1_);
          auVar35[2] = -(*(char *)((long)plVar6 + 7) == local_48._2_1_);
          auVar35[3] = -((char)plVar6[1] == local_48._3_1_);
          auVar35[4] = -(*(char *)((long)plVar6 + 9) == local_48._4_1_);
          auVar35[5] = -(*(char *)((long)plVar6 + 10) == local_48._5_1_);
          auVar35[6] = -(*(char *)((long)plVar6 + 0xb) == local_48._6_1_);
          auVar35[7] = -(*(char *)((long)plVar6 + 0xc) == local_48._7_1_);
          auVar35[8] = -(*(char *)((long)plVar6 + 0xd) == (char)uStack_40);
          auVar35[9] = -(*(char *)((long)plVar6 + 0xe) == uStack_40._1_1_);
          auVar35[10] = -(*(char *)((long)plVar6 + 0xf) == uStack_40._2_1_);
          auVar35[0xb] = -((char)plVar6[2] == uStack_40._3_1_);
          auVar35[0xc] = -(*(char *)((long)plVar6 + 0x11) == uStack_40._4_1_);
          auVar35[0xd] = -(*(char *)((long)plVar6 + 0x12) == uStack_40._5_1_);
          auVar35[0xe] = -(*(char *)((long)plVar6 + 0x13) == uStack_40._6_1_);
          auVar35[0xf] = -(*(char *)((long)plVar6 + 0x14) == uStack_40._7_1_);
          auVar35 = auVar35 & auVar25;
          if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetTotalPhysicalMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_15);
          }
          else {
            auVar26[0] = -((char)*plVar6 == 'P');
            auVar26[1] = -(*(char *)((long)plVar6 + 1) == 'R');
            auVar26[2] = -(*(char *)((long)plVar6 + 2) == 'O');
            auVar26[3] = -(*(char *)((long)plVar6 + 3) == 'C');
            auVar26[4] = -(*(char *)((long)plVar6 + 4) == 'E');
            auVar26[5] = -(*(char *)((long)plVar6 + 5) == 'S');
            auVar26[6] = -(*(char *)((long)plVar6 + 6) == 'S');
            auVar26[7] = -(*(char *)((long)plVar6 + 7) == 'O');
            auVar26[8] = -((char)plVar6[1] == 'R');
            auVar26[9] = -(*(char *)((long)plVar6 + 9) == '_');
            auVar26[10] = -(*(char *)((long)plVar6 + 10) == 'D');
            auVar26[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'E');
            auVar26[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'S');
            auVar26[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'C');
            auVar26[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'R');
            auVar26[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'I');
            auVar36[0] = -(*(char *)((long)plVar6 + 5) == 'S');
            auVar36[1] = -(*(char *)((long)plVar6 + 6) == 'S');
            auVar36[2] = -(*(char *)((long)plVar6 + 7) == 'O');
            auVar36[3] = -((char)plVar6[1] == 'R');
            auVar36[4] = -(*(char *)((long)plVar6 + 9) == '_');
            auVar36[5] = -(*(char *)((long)plVar6 + 10) == 'D');
            auVar36[6] = -(*(char *)((long)plVar6 + 0xb) == 'E');
            auVar36[7] = -(*(char *)((long)plVar6 + 0xc) == 'S');
            auVar36[8] = -(*(char *)((long)plVar6 + 0xd) == 'C');
            auVar36[9] = -(*(char *)((long)plVar6 + 0xe) == 'R');
            auVar36[10] = -(*(char *)((long)plVar6 + 0xf) == 'I');
            auVar36[0xb] = -((char)plVar6[2] == 'P');
            auVar36[0xc] = -(*(char *)((long)plVar6 + 0x11) == 'T');
            auVar36[0xd] = -(*(char *)((long)plVar6 + 0x12) == 'I');
            auVar36[0xe] = -(*(char *)((long)plVar6 + 0x13) == 'O');
            auVar36[0xf] = -(*(char *)((long)plVar6 + 0x14) == 'N');
            auVar36 = auVar36 & auVar26;
            if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) break;
            cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                      ((string *)local_280,&cmCMakeHostSystemInformationCommand::info);
          }
          goto LAB_0022d5c8;
        case 0x17:
          auVar23[0] = -((char)*plVar6 == 'N');
          auVar23[1] = -(*(char *)((long)plVar6 + 1) == 'U');
          auVar23[2] = -(*(char *)((long)plVar6 + 2) == 'M');
          auVar23[3] = -(*(char *)((long)plVar6 + 3) == 'B');
          auVar23[4] = -(*(char *)((long)plVar6 + 4) == 'E');
          auVar23[5] = -(*(char *)((long)plVar6 + 5) == 'R');
          auVar23[6] = -(*(char *)((long)plVar6 + 6) == '_');
          auVar23[7] = -(*(char *)((long)plVar6 + 7) == 'O');
          auVar23[8] = -((char)plVar6[1] == 'F');
          auVar23[9] = -(*(char *)((long)plVar6 + 9) == '_');
          auVar23[10] = -(*(char *)((long)plVar6 + 10) == 'L');
          auVar23[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'O');
          auVar23[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'G');
          auVar23[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'I');
          auVar23[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'C');
          auVar23[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'A');
          auVar33[0] = -(*(char *)((long)plVar6 + 7) == 'O');
          auVar33[1] = -((char)plVar6[1] == 'F');
          auVar33[2] = -(*(char *)((long)plVar6 + 9) == '_');
          auVar33[3] = -(*(char *)((long)plVar6 + 10) == 'L');
          auVar33[4] = -(*(char *)((long)plVar6 + 0xb) == 'O');
          auVar33[5] = -(*(char *)((long)plVar6 + 0xc) == 'G');
          auVar33[6] = -(*(char *)((long)plVar6 + 0xd) == 'I');
          auVar33[7] = -(*(char *)((long)plVar6 + 0xe) == 'C');
          auVar33[8] = -(*(char *)((long)plVar6 + 0xf) == 'A');
          auVar33[9] = -((char)plVar6[2] == 'L');
          auVar33[10] = -(*(char *)((long)plVar6 + 0x11) == '_');
          auVar33[0xb] = -(*(char *)((long)plVar6 + 0x12) == 'C');
          auVar33[0xc] = -(*(char *)((long)plVar6 + 0x13) == 'O');
          auVar33[0xd] = -(*(char *)((long)plVar6 + 0x14) == 'R');
          auVar33[0xe] = -(*(char *)((long)plVar6 + 0x15) == 'E');
          auVar33[0xf] = -(*(char *)((long)plVar6 + 0x16) == 'S');
          auVar33 = auVar33 & auVar23;
          if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
            uVar11 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)uVar11,value_13);
          }
          else {
            auVar24[0] = -((char)*plVar6 == 'P');
            auVar24[1] = -(*(char *)((long)plVar6 + 1) == 'R');
            auVar24[2] = -(*(char *)((long)plVar6 + 2) == 'O');
            auVar24[3] = -(*(char *)((long)plVar6 + 3) == 'C');
            auVar24[4] = -(*(char *)((long)plVar6 + 4) == 'E');
            auVar24[5] = -(*(char *)((long)plVar6 + 5) == 'S');
            auVar24[6] = -(*(char *)((long)plVar6 + 6) == 'S');
            auVar24[7] = -(*(char *)((long)plVar6 + 7) == 'O');
            auVar24[8] = -((char)plVar6[1] == 'R');
            auVar24[9] = -(*(char *)((long)plVar6 + 9) == '_');
            auVar24[10] = -(*(char *)((long)plVar6 + 10) == 'S');
            auVar24[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'E');
            auVar24[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'R');
            auVar24[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'I');
            auVar24[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'A');
            auVar24[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'L');
            auVar34[0] = -(*(char *)((long)plVar6 + 7) == 'O');
            auVar34[1] = -((char)plVar6[1] == 'R');
            auVar34[2] = -(*(char *)((long)plVar6 + 9) == '_');
            auVar34[3] = -(*(char *)((long)plVar6 + 10) == 'S');
            auVar34[4] = -(*(char *)((long)plVar6 + 0xb) == 'E');
            auVar34[5] = -(*(char *)((long)plVar6 + 0xc) == 'R');
            auVar34[6] = -(*(char *)((long)plVar6 + 0xd) == 'I');
            auVar34[7] = -(*(char *)((long)plVar6 + 0xe) == 'A');
            auVar34[8] = -(*(char *)((long)plVar6 + 0xf) == 'L');
            auVar34[9] = -((char)plVar6[2] == '_');
            auVar34[10] = -(*(char *)((long)plVar6 + 0x11) == 'N');
            auVar34[0xb] = -(*(char *)((long)plVar6 + 0x12) == 'U');
            auVar34[0xc] = -(*(char *)((long)plVar6 + 0x13) == 'M');
            auVar34[0xd] = -(*(char *)((long)plVar6 + 0x14) == 'B');
            auVar34[0xe] = -(*(char *)((long)plVar6 + 0x15) == 'E');
            auVar34[0xf] = -(*(char *)((long)plVar6 + 0x16) == 'R');
            auVar34 = auVar34 & auVar24;
            if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff) break;
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetProcessorSerialNumber
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_02);
          }
          goto LAB_0022d5c8;
        case 0x18:
          auVar20[0] = -((char)*plVar6 == 'N');
          auVar20[1] = -(*(char *)((long)plVar6 + 1) == 'U');
          auVar20[2] = -(*(char *)((long)plVar6 + 2) == 'M');
          auVar20[3] = -(*(char *)((long)plVar6 + 3) == 'B');
          auVar20[4] = -(*(char *)((long)plVar6 + 4) == 'E');
          auVar20[5] = -(*(char *)((long)plVar6 + 5) == 'R');
          auVar20[6] = -(*(char *)((long)plVar6 + 6) == '_');
          auVar20[7] = -(*(char *)((long)plVar6 + 7) == 'O');
          auVar20[8] = -((char)plVar6[1] == 'F');
          auVar20[9] = -(*(char *)((long)plVar6 + 9) == '_');
          auVar20[10] = -(*(char *)((long)plVar6 + 10) == 'P');
          auVar20[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'H');
          auVar20[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'Y');
          auVar20[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'S');
          auVar20[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'I');
          auVar20[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'C');
          lVar1 = plVar6[2];
          auVar30[0] = -((char)lVar1 == 'A');
          auVar30[1] = -((char)((ulong)lVar1 >> 8) == 'L');
          auVar30[2] = -((char)((ulong)lVar1 >> 0x10) == '_');
          auVar30[3] = -((char)((ulong)lVar1 >> 0x18) == 'C');
          auVar30[4] = -((char)((ulong)lVar1 >> 0x20) == 'O');
          auVar30[5] = -((char)((ulong)lVar1 >> 0x28) == 'R');
          auVar30[6] = -((char)((ulong)lVar1 >> 0x30) == 'E');
          auVar30[7] = -((char)((ulong)lVar1 >> 0x38) == 'S');
          auVar30[8] = 0xff;
          auVar30[9] = 0xff;
          auVar30[10] = 0xff;
          auVar30[0xb] = 0xff;
          auVar30[0xc] = 0xff;
          auVar30[0xd] = 0xff;
          auVar30[0xe] = 0xff;
          auVar30[0xf] = 0xff;
          auVar30 = auVar30 & auVar20;
          if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
            uVar11 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)uVar11,value_12);
          }
          else {
            auVar21[0] = -((char)*plVar6 == 'A');
            auVar21[1] = -(*(char *)((long)plVar6 + 1) == 'V');
            auVar21[2] = -(*(char *)((long)plVar6 + 2) == 'A');
            auVar21[3] = -(*(char *)((long)plVar6 + 3) == 'I');
            auVar21[4] = -(*(char *)((long)plVar6 + 4) == 'L');
            auVar21[5] = -(*(char *)((long)plVar6 + 5) == 'A');
            auVar21[6] = -(*(char *)((long)plVar6 + 6) == 'B');
            auVar21[7] = -(*(char *)((long)plVar6 + 7) == 'L');
            auVar21[8] = -((char)plVar6[1] == 'E');
            auVar21[9] = -(*(char *)((long)plVar6 + 9) == '_');
            auVar21[10] = -(*(char *)((long)plVar6 + 10) == 'V');
            auVar21[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'I');
            auVar21[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'R');
            auVar21[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'T');
            auVar21[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'U');
            auVar21[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'A');
            lVar1 = plVar6[2];
            auVar31[0] = -((char)lVar1 == 'L');
            auVar31[1] = -((char)((ulong)lVar1 >> 8) == '_');
            auVar31[2] = -((char)((ulong)lVar1 >> 0x10) == 'M');
            auVar31[3] = -((char)((ulong)lVar1 >> 0x18) == 'E');
            auVar31[4] = -((char)((ulong)lVar1 >> 0x20) == 'M');
            auVar31[5] = -((char)((ulong)lVar1 >> 0x28) == 'O');
            auVar31[6] = -((char)((ulong)lVar1 >> 0x30) == 'R');
            auVar31[7] = -((char)((ulong)lVar1 >> 0x38) == 'Y');
            auVar31[8] = 0xff;
            auVar31[9] = 0xff;
            auVar31[10] = 0xff;
            auVar31[0xb] = 0xff;
            auVar31[0xc] = 0xff;
            auVar31[0xd] = 0xff;
            auVar31[0xe] = 0xff;
            auVar31[0xf] = 0xff;
            auVar31 = auVar31 & auVar21;
            if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) break;
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetAvailableVirtualMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_00);
          }
LAB_0022d5c8:
          in_stack_fffffffffffffd20._M_p = (pointer)local_280._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ == &local_270) {
            local_2d0._8_8_ = local_270._8_8_;
            in_stack_fffffffffffffd20._M_p = (pointer)&local_2d0;
          }
          local_2d0._M_allocated_capacity = local_270._M_allocated_capacity;
          local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._8_8_;
          local_2c0 = 1;
LAB_0022d612:
          local_2b0._M_dataplus._M_p = in_stack_fffffffffffffd20._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffd20._M_p == &local_2d0) {
            local_2b0.field_2._8_8_ = local_2d0._8_8_;
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          }
          local_2b0.field_2._M_allocated_capacity = local_2d0._M_allocated_capacity;
          local_2b0._M_string_length = (size_type)local_2d8;
          local_2d0._M_allocated_capacity = local_2d0._M_allocated_capacity & 0xffffffffffffff00;
          local_290[0] = '\x01';
          in_stack_fffffffffffffd20._M_p = (pointer)&local_2d0;
          goto LAB_0022d65f;
        case 0x19:
          auVar27[0] = -((char)*plVar6 == 'A');
          auVar27[1] = -(*(char *)((long)plVar6 + 1) == 'V');
          auVar27[2] = -(*(char *)((long)plVar6 + 2) == 'A');
          auVar27[3] = -(*(char *)((long)plVar6 + 3) == 'I');
          auVar27[4] = -(*(char *)((long)plVar6 + 4) == 'L');
          auVar27[5] = -(*(char *)((long)plVar6 + 5) == 'A');
          auVar27[6] = -(*(char *)((long)plVar6 + 6) == 'B');
          auVar27[7] = -(*(char *)((long)plVar6 + 7) == 'L');
          auVar27[8] = -((char)plVar6[1] == 'E');
          auVar27[9] = -(*(char *)((long)plVar6 + 9) == '_');
          auVar27[10] = -(*(char *)((long)plVar6 + 10) == 'P');
          auVar27[0xb] = -(*(char *)((long)plVar6 + 0xb) == 'H');
          auVar27[0xc] = -(*(char *)((long)plVar6 + 0xc) == 'Y');
          auVar27[0xd] = -(*(char *)((long)plVar6 + 0xd) == 'S');
          auVar27[0xe] = -(*(char *)((long)plVar6 + 0xe) == 'I');
          auVar27[0xf] = -(*(char *)((long)plVar6 + 0xf) == 'C');
          auVar37[0] = -(*(char *)((long)plVar6 + 9) == (char)local_48);
          auVar37[1] = -(*(char *)((long)plVar6 + 10) == local_48._1_1_);
          auVar37[2] = -(*(char *)((long)plVar6 + 0xb) == local_48._2_1_);
          auVar37[3] = -(*(char *)((long)plVar6 + 0xc) == local_48._3_1_);
          auVar37[4] = -(*(char *)((long)plVar6 + 0xd) == local_48._4_1_);
          auVar37[5] = -(*(char *)((long)plVar6 + 0xe) == local_48._5_1_);
          auVar37[6] = -(*(char *)((long)plVar6 + 0xf) == local_48._6_1_);
          auVar37[7] = -((char)plVar6[2] == local_48._7_1_);
          auVar37[8] = -(*(char *)((long)plVar6 + 0x11) == (char)uStack_40);
          auVar37[9] = -(*(char *)((long)plVar6 + 0x12) == uStack_40._1_1_);
          auVar37[10] = -(*(char *)((long)plVar6 + 0x13) == uStack_40._2_1_);
          auVar37[0xb] = -(*(char *)((long)plVar6 + 0x14) == uStack_40._3_1_);
          auVar37[0xc] = -(*(char *)((long)plVar6 + 0x15) == uStack_40._4_1_);
          auVar37[0xd] = -(*(char *)((long)plVar6 + 0x16) == uStack_40._5_1_);
          auVar37[0xe] = -(*(char *)((long)plVar6 + 0x17) == uStack_40._6_1_);
          auVar37[0xf] = -((char)plVar6[3] == uStack_40._7_1_);
          auVar37 = auVar37 & auVar27;
          if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var12 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetAvailablePhysicalMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var12,value_08);
            goto LAB_0022d5c8;
          }
        }
switchD_0022cac4_caseD_5:
        local_2c0 = 0;
LAB_0022d074:
        local_280._8_8_ = (local_110->_M_dataplus)._M_p;
        local_280._0_8_ = local_110->_M_string_length;
        p_Var12 = (_anonymous_namespace_ *)0x0;
        __str._M_str = "DISTRIB_";
        __str._M_len = 8;
        iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_280,0,8,__str)
        ;
        pcVar17 = local_290;
        if (iVar10 == 0) {
          if (((anonymous_namespace)::
               GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::s_os_release_abi_cxx11_ == '\0') &&
             (iVar10 = __cxa_guard_acquire(&(anonymous_namespace)::
                                            GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                            ::s_os_release_abi_cxx11_), iVar10 != 0)) {
            (anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)status->Makefile,p_Var12,status_00);
            __cxa_atexit(std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::~map,(anonymous_namespace)::
                                GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                ::s_os_release_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::s_os_release_abi_cxx11_);
          }
          local_c0 = status->Makefile;
          std::__cxx11::string::substr((ulong)&local_138,(ulong)local_110);
          if ((local_138._8_8_ == 4) && (*(int *)local_138._M_allocated_capacity == 0x4f464e49)) {
            local_158.Begin._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
            local_158.End._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_148._M_local_buf[0] = '\0';
            p_Var14 = (_Rb_tree_node_base *)
                      (anonymous_namespace)::
                      GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                      ::s_os_release_abi_cxx11_._24_8_;
            if ((anonymous_namespace)::
                GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                ::s_os_release_abi_cxx11_._24_8_ == 0x9b8d50) {
LAB_0022d4c3:
              local_1c0._0_8_ = &local_1b0;
              local_1b0._M_allocated_capacity =
                   CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
              local_1b0._8_8_ = local_148._8_8_;
            }
            else {
              do {
                local_280._8_8_ = pbVar2[1]._M_dataplus._M_p;
                local_280._0_8_ = pbVar2[1]._M_string_length;
                local_270._8_8_ = local_a8;
                local_b8._8_8_ = local_270._8_8_;
                local_b8._0_8_ = 1;
                local_a8[0] = 0x5f;
                local_270._M_allocated_capacity = 1;
                local_258 = *(size_t *)(p_Var14 + 1);
                local_260 = p_Var14[1]._M_parent;
                views._M_len = 3;
                views._M_array = (iterator)local_280;
                cmCatViews_abi_cxx11_(&local_e8,views);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_280,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (&(anonymous_namespace)::DELIM_abi_cxx11_ +
                               (ulong)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)local_158.End._M_current !=
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x0) * 4),&local_e8);
                std::__cxx11::string::_M_append((char *)&local_158,local_280._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._0_8_ != &local_270) {
                  operator_delete((void *)local_280._0_8_,
                                  (ulong)(local_270._M_allocated_capacity + 1));
                }
                value_25._M_str = *(char **)(p_Var14 + 2);
                value_25._M_len = (size_t)p_Var14[2]._M_parent;
                cmMakefile::AddDefinition(local_c0,&local_e8,value_25);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              } while (p_Var14 !=
                       (_Rb_tree_node_base *)
                       ((anonymous_namespace)::
                        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::s_os_release_abi_cxx11_ + 8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.Begin._M_current == &local_148) goto LAB_0022d4c3;
              local_1c0._0_8_ = local_158.Begin._M_current;
              local_1b0._M_allocated_capacity =
                   CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
            }
            local_1c0._8_8_ = local_158.End._M_current;
          }
          else {
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(anonymous_namespace)::
                               GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::s_os_release_abi_cxx11_,(key_type *)&local_138);
            if (cVar13._M_node ==
                (_Base_ptr)
                ((anonymous_namespace)::
                 GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ + 8)) {
              local_1c0._0_8_ = &local_1b0;
              local_1b0._M_allocated_capacity = local_1b0._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_1c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
            }
            else {
              local_1c0._0_8_ = &local_1b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1c0,*(long *)(cVar13._M_node + 2),
                         (long)&(cVar13._M_node[2]._M_parent)->_M_color +
                         *(long *)(cVar13._M_node + 2));
            }
          }
          local_1a0[0] = 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            local_128._M_allocated_capacity + 1);
            pcVar17 = local_290;
            if (((undefined1  [16])_local_1a0 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_0022d579;
          }
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_ == &local_1b0) {
            local_2b0.field_2._8_8_ = local_1b0._8_8_;
          }
          else {
            local_2b0._M_dataplus._M_p = (pointer)local_1c0._0_8_;
          }
          local_2b0.field_2._M_allocated_capacity = local_1b0._M_allocated_capacity;
          local_2b0._M_string_length = local_1c0._8_8_;
          local_290[0] = '\x01';
          pcVar17 = local_1a0;
        }
LAB_0022d579:
        *pcVar17 = '\0';
LAB_0022d65f:
        if (((local_2c0 & 1) != 0) &&
           (local_2c0 = 0,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)in_stack_fffffffffffffd20._M_p != &local_2d0)) {
          operator_delete(in_stack_fffffffffffffd20._M_p,
                          (ulong)(local_2d0._M_allocated_capacity + 1));
        }
        cVar8 = local_290[0];
        if (local_290[0] == '\0') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_280,"does not recognize <key> ",local_110);
          std::__cxx11::string::_M_assign(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &local_270) {
            operator_delete((void *)local_280._0_8_,(ulong)(local_270._M_allocated_capacity + 1));
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_2b0._M_dataplus._M_p);
        }
        if ((local_290[0] == '\x01') &&
           (local_290[0] = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
        }
        if (cVar8 == '\0') {
          bVar9 = false;
          goto LAB_0022d855;
        }
        local_288 = (cmMakefile *)
                    ((long)&(local_288->FindPackageRootPathStack).
                            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map + 1);
      } while (local_288 <
               (cmMakefile *)
               ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    bVar9 = true;
    value_26._M_str = local_108;
    value_26._M_len = local_100;
    cmMakefile::AddDefinition(status->Makefile,local_1c8,value_26);
LAB_0022d855:
    if (local_108 == &local_f8) {
      return bVar9;
    }
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    return bVar9;
  }
  pcVar17 = pbVar2[3]._M_dataplus._M_p;
  auVar19[0] = -(*pcVar17 == 'W');
  auVar19[1] = -(pcVar17[1] == 'I');
  auVar19[2] = -(pcVar17[2] == 'N');
  auVar19[3] = -(pcVar17[3] == 'D');
  auVar19[4] = -(pcVar17[4] == 'O');
  auVar19[5] = -(pcVar17[5] == 'W');
  auVar19[6] = -(pcVar17[6] == 'S');
  auVar19[7] = -(pcVar17[7] == '_');
  auVar19[8] = -(pcVar17[8] == 'R');
  auVar19[9] = -(pcVar17[9] == 'E');
  auVar19[10] = -(pcVar17[10] == 'G');
  auVar19[0xb] = -(pcVar17[0xb] == 'I');
  auVar19[0xc] = -(pcVar17[0xc] == 'S');
  auVar19[0xd] = -(pcVar17[0xd] == 'T');
  auVar19[0xe] = -(pcVar17[0xe] == 'R');
  auVar19[0xf] = -(pcVar17[0xf] == 'Y');
  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf)
      != 0xffff) goto LAB_0022c99d;
  local_158.Begin._M_current = pbVar2 + 4;
  local_158.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.Begin._M_current == paVar3) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing <key> specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0022c8d5;
  }
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  name_00.super_string_view._M_str = "VALUE";
  name_00.super_string_view._M_len = 5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8,name_00,0x30);
  name_01.super_string_view._M_str = "VALUE_NAMES";
  name_01.super_string_view._M_len = 0xb;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_b8,name_01,0x50);
  name_02.super_string_view._M_str = "SUBKEYS";
  name_02.super_string_view._M_len = 7;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_b8,name_02,0x51);
  name_03.super_string_view._M_str = "VIEW";
  name_03.super_string_view._M_len = 4;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8,name_03,0x58);
  name_04.super_string_view._M_str = "SEPARATOR";
  name_04.super_string_view._M_len = 9;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8,name_04,0x78);
  name_05.super_string_view._M_str = "ERROR_VARIABLE";
  name_05.super_string_view._M_len = 0xe;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8,name_05,0x98);
  local_1b0._M_allocated_capacity = (size_type)&local_138;
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )0x0;
  local_158.Begin._M_current = local_158.Begin._M_current + 1;
  local_128._M_allocated_capacity = 0;
  local_270._8_8_ = local_280 + 8;
  local_280._8_8_ = (ulong)(uint)local_280._12_4_ << 0x20;
  local_270._M_allocated_capacity = 0;
  local_258 = 0;
  local_248 = 0;
  local_240 = '\0';
  local_230 = 0;
  local_220 = 0;
  local_218 = 0;
  local_208 = &local_1f8;
  local_200 = (pointer)0x0;
  local_1f8 = '\0';
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1c0._8_8_ = local_280;
  local_1a0 = (undefined1  [8])0x0;
  pcStack_198 = (char *)0x0;
  local_190 = (undefined1  [16])0x0;
  local_180 = (_Any_data)0x0;
  local_170 = (undefined1  [16])0x0;
  local_160 = false;
  local_260 = (_Base_ptr)local_270._8_8_;
  local_250 = &local_240;
  local_228 = &local_218;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1c0._0_8_ = local_b8;
  local_1b0._8_8_ = local_1c0._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_1c0,&local_158,0);
  if ((_Manager_type)local_170._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_170._0_8_)(&local_180,&local_180,__destroy_functor);
  }
  if (local_138._M_allocated_capacity != local_138._8_8_) {
    separator_00._M_str = ", ";
    separator_00._M_len = 2;
    cmJoin(&local_2b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_138,separator_00,(string_view)ZEXT816(0));
    local_1c0._0_8_ = (pointer)0x1b;
    local_1c0._8_8_ = "given invalid argument(s) \"";
    local_1b0._M_allocated_capacity = local_2b0._M_string_length;
    local_1b0._8_8_ = local_2b0._M_dataplus._M_p;
    pcStack_198 = "\".";
    local_1a0 = (undefined1  [8])0x2;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1c0;
    cmCatViews_abi_cxx11_((string *)&stack0xfffffffffffffd20,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffd20._M_p != &local_2d0) {
      operator_delete(in_stack_fffffffffffffd20._M_p,(ulong)(local_2d0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    bVar18 = false;
    goto LAB_0022df6a;
  }
  bVar9 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_280,status->Makefile);
  bVar18 = true;
  if (bVar9) goto LAB_0022df6a;
  if (local_248 == 0) {
    if (((char)local_230 != '\0') && (local_230._1_1_ == '\x01')) goto LAB_0022dbcb;
LAB_0022dc2b:
    if ((local_220 == 0) ||
       (sVar40._M_str = in_stack_fffffffffffffd20._M_p, sVar40._M_len = in_stack_fffffffffffffd18,
       oVar15 = cmWindowsRegistry::ToView(sVar40),
       ((ulong)oVar15.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
               super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
      local_288 = status->Makefile;
      view._M_value = Both;
      cmMakefile::AddDefinition(local_288,local_1c8,(string_view)(ZEXT816(0x806b49) << 0x40));
      if (local_220 != 0) {
        name._M_str = in_stack_fffffffffffffd20._M_p;
        name._M_len = in_stack_fffffffffffffd18;
        oVar15 = cmWindowsRegistry::ToView(name);
        view._M_value =
             oVar15.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
             super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
      }
      cmWindowsRegistry::cmWindowsRegistry
                ((cmWindowsRegistry *)&stack0xfffffffffffffd20,local_288,
                 &cmWindowsRegistry::AllTypes);
      if ((char)local_230 == '\x01') {
        key._M_str = pbVar2[4]._M_dataplus._M_p;
        key._M_len = pbVar2[4]._M_string_length;
        cmWindowsRegistry::GetValueNames_abi_cxx11_
                  ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1c0,(cmWindowsRegistry *)&stack0xfffffffffffffd20,key,view._M_value);
        if (local_1b0._M_local_buf[8] == 1) {
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          cmJoin(&local_2b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c0,separator_01,(string_view)ZEXT816(0));
          value_27._M_str = local_2b0._M_dataplus._M_p;
          value_27._M_len = local_2b0._M_string_length;
          cmMakefile::AddDefinition(local_288,local_1c8,value_27);
LAB_0022de19:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,
                            (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
          }
        }
LAB_0022de3b:
        if ((local_1b0._M_local_buf[8] & 1U) != 0) {
          local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0);
        }
      }
      else {
        if (local_230._1_1_ == '\x01') {
          key_00._M_str = pbVar2[4]._M_dataplus._M_p;
          key_00._M_len = pbVar2[4]._M_string_length;
          cmWindowsRegistry::GetSubKeys_abi_cxx11_
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1c0,(cmWindowsRegistry *)&stack0xfffffffffffffd20,key_00,view._M_value
                    );
          if (local_1b0._M_local_buf[8] == 1) {
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin(&local_2b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c0,separator_02,(string_view)ZEXT816(0));
            value_28._M_str = local_2b0._M_dataplus._M_p;
            value_28._M_len = local_2b0._M_string_length;
            cmMakefile::AddDefinition(local_288,local_1c8,value_28);
            goto LAB_0022de19;
          }
          goto LAB_0022de3b;
        }
        local_e8._M_dataplus._M_p = local_200;
        local_e8._M_string_length = (size_type)local_208;
        separator._M_str = local_208;
        separator._M_len = (size_t)local_200;
        key_01._M_str = pbVar2[4]._M_dataplus._M_p;
        key_01._M_len = pbVar2[4]._M_string_length;
        name_06._M_str = local_250;
        name_06._M_len = local_248;
        cmWindowsRegistry::ReadValue_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0,(cmWindowsRegistry *)&stack0xfffffffffffffd20,key_01,name_06,
                   view._M_value,separator);
        if ((bool)local_1a0[0] == true) {
          value_29._M_str = (char *)local_1c0._0_8_;
          value_29._M_len = local_1c0._8_8_;
          cmMakefile::AddDefinition(local_288,local_1c8,value_29);
        }
        if ((local_1a0[0] & 1) != 0) {
          auVar7[0xf] = 0;
          auVar7._0_15_ = stack0xfffffffffffffe61;
          _local_1a0 = (string_view)(auVar7 << 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_ != &local_1b0) {
            operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
          }
        }
      }
      if (local_1e8._M_string_length != 0) {
        sVar40 = cmWindowsRegistry::GetLastError((cmWindowsRegistry *)&stack0xfffffffffffffd20);
        cmMakefile::AddDefinition(local_288,&local_1e8,sVar40);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffd20._M_p != &local_2d0) {
        operator_delete(in_stack_fffffffffffffd20._M_p,(ulong)(local_2d0._M_allocated_capacity + 1))
        ;
      }
      goto LAB_0022df6a;
    }
    local_1c0._0_8_ = (pointer)0x20;
    local_1c0._8_8_ = "given invalid value for \"VIEW\": ";
    local_108 = (char *)CONCAT71(local_108._1_7_,0x2e);
    cmStrCat<char>(&local_2b0,(cmAlphaNum *)local_1c0,(cmAlphaNum *)&stack0xfffffffffffffd20,
                   (char *)&local_108);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
LAB_0022dc1c:
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    if (((char)local_230 == '\0') && (local_230._1_1_ == '\0')) goto LAB_0022dc2b;
LAB_0022dbcb:
    local_1c0._0_8_ = &local_1b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,
               "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\".","")
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_2b0.field_2._M_allocated_capacity = local_1b0._M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)local_1c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != &local_1b0) goto LAB_0022dc1c;
  }
  bVar18 = false;
LAB_0022df6a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)(local_68 + 8));
  if ((_Manager_type)local_78._8_8_ != (_Manager_type)0x0) {
    (*(code *)local_78._8_8_)
              ((_Any_data *)(local_88 + 8),(_Any_data *)(local_88 + 8),__destroy_functor);
  }
  if ((_Manager_type)local_98._8_8_ != (_Manager_type)0x0) {
    (*(code *)local_98._8_8_)
              ((_Any_data *)(local_a8 + 8),(_Any_data *)(local_a8 + 8),__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)local_b8);
  return bVar18;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetValue(status, key, variable); }
#ifdef HAVE_VS_SETUP_HELPER
        , [&]() { return GetValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}